

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O0

void __thiscall
t_lua_generator::generate_serialize_field
          (t_lua_generator *this,ostream *out,t_field *tfield,string *prefix)

{
  byte bVar1;
  t_type *type_00;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ostream *poVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [12];
  string local_c8;
  t_base local_a4;
  undefined1 local_a0 [4];
  t_base tbase;
  string local_80;
  undefined1 local_50 [8];
  string name;
  t_type *type;
  string *prefix_local;
  t_field *tfield_local;
  ostream *out_local;
  t_lua_generator *this_local;
  
  type_00 = t_field::get_type(tfield);
  name.field_2._8_8_ = t_generator::get_true_type(type_00);
  __rhs = t_field::get_name_abi_cxx11_(tfield);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 prefix,__rhs);
  bVar1 = (**(code **)(*(long *)name.field_2._8_8_ + 0x20))();
  if ((bVar1 & 1) == 0) {
    bVar1 = (**(code **)(*(long *)name.field_2._8_8_ + 0x58))();
    if (((bVar1 & 1) == 0) &&
       (bVar1 = (**(code **)(*(long *)name.field_2._8_8_ + 0x60))(), (bVar1 & 1) == 0)) {
      bVar1 = (**(code **)(*(long *)name.field_2._8_8_ + 0x68))();
      uVar4 = name.field_2._8_8_;
      if ((bVar1 & 1) == 0) {
        bVar1 = (**(code **)(*(long *)name.field_2._8_8_ + 0x28))();
        if (((bVar1 & 1) == 0) &&
           (bVar1 = (**(code **)(*(long *)name.field_2._8_8_ + 0x50))(), (bVar1 & 1) == 0)) {
          uVar4 = std::__cxx11::string::c_str();
          (**(code **)(*(long *)name.field_2._8_8_ + 0x18))();
          uVar5 = std::__cxx11::string::c_str();
          printf("DO NOT KNOW HOW TO SERIALIZE FIELD \'%s\' TYPE \'%s\'\n",uVar4,uVar5);
        }
        else {
          poVar3 = t_generator::indent((t_generator *)this,out);
          std::operator<<(poVar3,"oprot:");
          bVar1 = (**(code **)(*(long *)name.field_2._8_8_ + 0x28))();
          if ((bVar1 & 1) == 0) {
            bVar1 = (**(code **)(*(long *)name.field_2._8_8_ + 0x50))();
            if ((bVar1 & 1) != 0) {
              poVar3 = std::operator<<(out,"writeI32(");
              poVar3 = std::operator<<(poVar3,(string *)local_50);
              std::operator<<(poVar3,")");
            }
          }
          else {
            local_a4 = t_base_type::get_base((t_base_type *)name.field_2._8_8_);
            switch(local_a4) {
            case TYPE_VOID:
              pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __cxa_allocate_exception(0x20);
              std::operator+(pbVar2,"compiler error: cannot serialize void field in a struct: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_50);
              __cxa_throw(pbVar2,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            case TYPE_STRING:
              poVar3 = std::operator<<(out,"writeString(");
              poVar3 = std::operator<<(poVar3,(string *)local_50);
              std::operator<<(poVar3,")");
              break;
            case TYPE_BOOL:
              poVar3 = std::operator<<(out,"writeBool(");
              poVar3 = std::operator<<(poVar3,(string *)local_50);
              std::operator<<(poVar3,")");
              break;
            case TYPE_I8:
              poVar3 = std::operator<<(out,"writeByte(");
              poVar3 = std::operator<<(poVar3,(string *)local_50);
              std::operator<<(poVar3,")");
              break;
            case TYPE_I16:
              poVar3 = std::operator<<(out,"writeI16(");
              poVar3 = std::operator<<(poVar3,(string *)local_50);
              std::operator<<(poVar3,")");
              break;
            case TYPE_I32:
              poVar3 = std::operator<<(out,"writeI32(");
              poVar3 = std::operator<<(poVar3,(string *)local_50);
              std::operator<<(poVar3,")");
              break;
            case TYPE_I64:
              poVar3 = std::operator<<(out,"writeI64(");
              poVar3 = std::operator<<(poVar3,(string *)local_50);
              std::operator<<(poVar3,")");
              break;
            case TYPE_DOUBLE:
              poVar3 = std::operator<<(out,"writeDouble(");
              poVar3 = std::operator<<(poVar3,(string *)local_50);
              std::operator<<(poVar3,")");
              break;
            default:
              auVar6 = __cxa_allocate_exception(0x20);
              t_base_type::t_base_name_abi_cxx11_
                        (&local_c8,(t_base_type *)(ulong)local_a4,auVar6._8_4_);
              std::operator+(auVar6._0_8_,"compiler error: no PHP name for base type ",&local_c8);
              __cxa_throw(auVar6._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string
                         );
            }
          }
          std::operator<<(out,(string *)&::endl_abi_cxx11_);
        }
      }
      else {
        std::__cxx11::string::string((string *)local_a0,(string *)local_50);
        generate_serialize_container(this,out,(t_type *)uVar4,(string *)local_a0);
        std::__cxx11::string::~string((string *)local_a0);
      }
    }
    else {
      uVar4 = name.field_2._8_8_;
      std::__cxx11::string::string((string *)&local_80,(string *)local_50);
      generate_serialize_struct(this,out,(t_struct *)uVar4,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
    std::__cxx11::string::~string((string *)local_50);
    return;
  }
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
  std::operator+(pbVar2,"CANNOT GENERATE SERIALIZE CODE FOR void TYPE: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  __cxa_throw(pbVar2,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void t_lua_generator::generate_serialize_field(ostream& out, t_field* tfield, string prefix) {
  t_type* type = get_true_type(tfield->get_type());
  string name = prefix + tfield->get_name();

  // Do nothing for void types
  if (type->is_void()) {
    throw "CANNOT GENERATE SERIALIZE CODE FOR void TYPE: " + name;
  }

  if (type->is_struct() || type->is_xception()) {
    generate_serialize_struct(out, (t_struct*)type, name);
  } else if (type->is_container()) {
    generate_serialize_container(out, type, name);
  } else if (type->is_base_type() || type->is_enum()) {
    indent(out) << "oprot:";

    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "compiler error: cannot serialize void field in a struct: " + name;
        break;
      case t_base_type::TYPE_STRING:
        out << "writeString(" << name << ")";
        break;
      case t_base_type::TYPE_BOOL:
        out << "writeBool(" << name << ")";
        break;
      case t_base_type::TYPE_I8:
        out << "writeByte(" << name << ")";
        break;
      case t_base_type::TYPE_I16:
        out << "writeI16(" << name << ")";
        break;
      case t_base_type::TYPE_I32:
        out << "writeI32(" << name << ")";
        break;
      case t_base_type::TYPE_I64:
        out << "writeI64(" << name << ")";
        break;
      case t_base_type::TYPE_DOUBLE:
        out << "writeDouble(" << name << ")";
        break;
      default:
        throw "compiler error: no PHP name for base type " + t_base_type::t_base_name(tbase);
      }
    } else if (type->is_enum()) {
      out << "writeI32(" << name << ")";
    }
    out << endl;
  } else {
    printf("DO NOT KNOW HOW TO SERIALIZE FIELD '%s' TYPE '%s'\n",
           name.c_str(),
           type->get_name().c_str());
  }
}